

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Operation::InternalSwap(Operation *this,Operation *other)

{
  intptr_t iVar1;
  void *pvVar2;
  long __tmp;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::InnerMap::Swap((InnerMap *)&this->inputs_,(InnerMap *)&other->inputs_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->outputs_).super_RepeatedPtrFieldBase,
             &(other->outputs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->blocks_).super_RepeatedPtrFieldBase,
             &(other->blocks_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::InnerMap::Swap((InnerMap *)&this->attributes_,(InnerMap *)&other->attributes_);
  pvVar2 = (other->type_).tagged_ptr_.ptr_;
  (other->type_).tagged_ptr_.ptr_ = (this->type_).tagged_ptr_.ptr_;
  (this->type_).tagged_ptr_.ptr_ = pvVar2;
  return;
}

Assistant:

void Operation::InternalSwap(Operation* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  inputs_.InternalSwap(&other->inputs_);
  outputs_.InternalSwap(&other->outputs_);
  blocks_.InternalSwap(&other->blocks_);
  attributes_.InternalSwap(&other->attributes_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &type_, lhs_arena,
      &other->type_, rhs_arena
  );
}